

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCDisassembler.c
# Opt level: O2

_Bool PPC_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                        uint64_t address,void *info)

{
  byte bVar1;
  byte bVar2;
  cs_detail *__s;
  ushort *puVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint16_t uVar6;
  MCInst *pMVar7;
  MCInst *pMVar8;
  MCInst *MI;
  uint8_t *p;
  uint uVar9;
  uint uVar10;
  _Bool _Var11;
  uint local_50;
  uint local_4c;
  int local_48;
  uint local_44;
  MCInst *local_40;
  uint16_t *local_38;
  
  if (3 < code_len) {
    if (instr->csh->mode < CS_MODE_ARM) {
      uVar10 = *(uint *)code;
      local_4c = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18
      ;
    }
    else {
      local_4c = *(uint *)code;
    }
    __s = instr->flat_insn->detail;
    local_40 = instr;
    local_38 = size;
    if (__s != (cs_detail *)0x0) {
      memset(__s,0,0x5f8);
    }
    local_44 = ~local_4c;
    uVar10 = 0;
    local_48 = 3;
    pMVar8 = (MCInst *)DecoderTable32;
LAB_0018b72d:
    pMVar7 = pMVar8;
    switch((uint8_t)pMVar7->OpcodePub) {
    case '\x01':
      bVar1 = *(byte *)((long)&pMVar7->OpcodePub + 1);
      bVar2 = *(byte *)((long)&pMVar7->OpcodePub + 2);
      local_50 = (uint)bVar2;
      uVar10 = ~(-1 << (bVar2 & 0x1f)) << (bVar1 & 0x1f);
      if (bVar2 == 0x20) {
        uVar10 = 0xffffffff;
      }
      uVar10 = (uVar10 & local_4c) >> (bVar1 & 0x1f);
      pMVar8 = (MCInst *)((long)&pMVar7->OpcodePub + 3);
      goto LAB_0018b72d;
    case '\x02':
      uVar4 = decodeULEB128((uint8_t *)((long)&pMVar7->OpcodePub + 1),&local_50);
      pMVar8 = (MCInst *)((long)pMVar7->Operands + ((ulong)local_50 - 0xd));
      if (uVar10 == (uint)uVar4) goto LAB_0018b72d;
      puVar3 = (ushort *)((long)pMVar7->Operands + ((ulong)local_50 - 0xf));
      break;
    case '\x03':
      bVar1 = *(byte *)((long)&pMVar7->OpcodePub + 1);
      bVar2 = *(byte *)((long)&pMVar7->OpcodePub + 2);
      local_50 = (uint)bVar2;
      uVar9 = ~(-1 << (bVar2 & 0x1f)) << (bVar1 & 0x1f);
      if (bVar2 == 0x20) {
        uVar9 = 0xffffffff;
      }
      uVar9 = uVar9 & local_4c;
      uVar4 = decodeULEB128((uint8_t *)((long)&pMVar7->OpcodePub + 3),&local_50);
      pMVar8 = (MCInst *)((long)pMVar7->Operands + ((ulong)local_50 - 0xb));
      if (uVar9 >> (bVar1 & 0x1f) == (uint)uVar4) goto LAB_0018b72d;
      puVar3 = (ushort *)((long)pMVar7->Operands + ((ulong)local_50 - 0xd));
      break;
    case '\x04':
      decodeULEB128((uint8_t *)((long)&pMVar7->OpcodePub + 1),&local_50);
      pMVar8 = (MCInst *)((long)pMVar7->Operands + ((ulong)local_50 - 0xd));
      goto LAB_0018b72d;
    case '\x05':
      goto switchD_0018b745_caseD_5;
    case '\x06':
      goto switchD_0018b745_caseD_6;
    default:
      MCInst_clear(local_40);
      uVar6 = 0;
      _Var11 = false;
      size = local_38;
      goto LAB_0018b8e8;
    }
    pMVar8 = (MCInst *)((long)&((MCInst *)(pMVar8->Operands + -1))->OpcodePub + (ulong)*puVar3);
    goto LAB_0018b72d;
  }
  uVar6 = 0;
  _Var11 = false;
LAB_0018b8e8:
  *size = uVar6;
  return _Var11;
switchD_0018b745_caseD_6:
  uVar4 = decodeULEB128((uint8_t *)((long)&pMVar7->OpcodePub + 1),&local_50);
  p = (uint8_t *)((long)pMVar7->Operands + ((ulong)local_50 - 0xf));
  uVar5 = decodeULEB128(p,&local_50);
  pMVar8 = (MCInst *)(p + local_50);
  if (((uint)uVar5 & local_44) != 0 || ((uint)uVar4 & local_4c) != 0) {
    local_48 = 1;
  }
  goto LAB_0018b72d;
switchD_0018b745_caseD_5:
  MI = pMVar7;
  uVar4 = decodeULEB128((uint8_t *)((long)&pMVar7->OpcodePub + 1),&local_50);
  uVar5 = decodeULEB128((uint8_t *)((long)pMVar7->Operands + ((ulong)local_50 - 0xf)),&local_50);
  pMVar8 = local_40;
  MCInst_setOpcode(local_40,(uint)uVar4);
  decodeToMCInst_4((DecodeStatus)uVar5,local_4c,(uint32_t)pMVar8,MI,(uint64_t)size,(void *)address);
  _Var11 = local_48 == 3;
  uVar6 = 4;
  size = local_38;
  goto LAB_0018b8e8;
}

Assistant:

static DecodeStatus getInstruction(MCInst *MI,
		const uint8_t *code, size_t code_len,
		uint16_t *Size,
		uint64_t Address, MCRegisterInfo *MRI)
{
	uint32_t insn;
	DecodeStatus result;
	// Get the four bytes of the instruction.
	if (code_len < 4) {
		// not enough data
		*Size = 0;
		return MCDisassembler_Fail;
	}

	// The instruction is big-endian encoded.
	if (MI->csh->mode & CS_MODE_BIG_ENDIAN)
		insn = (code[0] << 24) | (code[1] << 16) |
			(code[2] <<  8) | (code[3] <<  0);
	else
		insn = (code[3] << 24) | (code[2] << 16) |
			(code[1] <<  8) | (code[0] <<  0);

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, sizeof(cs_detail));
	}

	result = decodeInstruction_4(DecoderTable32, MI, insn, Address, 4);
	if (result != MCDisassembler_Fail) {
		*Size = 4;
		return result;
	}

	// report error
	MCInst_clear(MI);
	*Size = 0;
	return MCDisassembler_Fail;
}